

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

void lsvm::system::run(void)

{
  ulong uVar1;
  
  uVar1 = run_time_slice();
  if ((long)uVar1 < 5000) {
    sleep(10);
    puts("sleep");
  }
  printf("%d\n",uVar1 & 0xffffffff);
  return;
}

Assistant:

void run(){
    //printf("%p %d\n",processes,processes_count);
    clock_t clocks = run_time_slice();
    if(clocks < max_time_slice_half){
        sleep(10);
        printf("sleep\n");
    }
    printf("%d\n",(int)clocks);
    //printf("%p %d\n",processes,processes_count);
}